

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall
ac::core::Image::create(Image *this,int w,int h,int c,ElementType elementType,int stride)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  ImageData *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  
  iVar1 = (elementType & 0xffU) * c * w;
  if (0 < stride) {
    iVar1 = stride;
  }
  if (0 < iVar1 * h) {
    this->w = w;
    this->h = h;
    this->c = c;
    this->elementType = elementType;
    this->pitch = iVar1;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00221740;
    p_Var3 = (_func_int *)malloc((ulong)(iVar1 * h + 0x28));
    if (p_Var3 == (_func_int *)0x0) {
      pp_Var4 = (_func_int **)0x0;
    }
    else {
      pp_Var4 = (_func_int **)((ulong)(p_Var3 + 0x27) & 0xffffffffffffffe0);
      pp_Var4[-1] = p_Var3;
    }
    p_Var2[1]._vptr__Sp_counted_base = pp_Var4;
    (this->dptr).super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    this_00 = (this->dptr).
              super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    (this->dptr).super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    this->pixels = ((this->dptr).
                    super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->data;
  }
  return;
}

Assistant:

void ac::core::Image::create(const int w, const int h, const int c, const ElementType elementType, const int stride)
{
    int pitch = stride > 0 ? stride : w * c * (elementType & 0xff);
    int size = h * pitch;
    if (!(size > 0)) return;
    this->w = w;
    this->h = h;
    this->c = c;
    this->elementType = elementType;
    this->pitch = pitch;
    this->dptr = std::make_shared<ImageData>(size);
    this->pixels = this->dptr->data;
}